

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FormatterBuffer.c
# Opt level: O1

ZyanStatus ZydisFormatterBufferAppend(ZydisFormatterBuffer *buffer,ZydisTokenType type)

{
  ZyanUSize ZVar1;
  void *pvVar2;
  ZyanStatus ZVar3;
  ulong uVar4;
  ulong uVar5;
  
  if (buffer == (ZydisFormatterBuffer *)0x0) {
    return 0x80100004;
  }
  ZVar3 = 0x100000;
  if (buffer->is_token_list != '\0') {
    ZVar1 = (buffer->string).vector.size;
    if (0xfe < ZVar1 - 1) {
      __assert_fail("(len > 0) && (len < 256)",
                    "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/FormatterBuffer.c"
                    ,0x7c,
                    "ZyanStatus ZydisFormatterBufferAppend(ZydisFormatterBuffer *, ZydisTokenType)")
      ;
    }
    uVar5 = ZVar1 + 2;
    ZVar3 = 0x80100009;
    uVar4 = buffer->capacity - uVar5;
    if (uVar5 <= buffer->capacity && uVar4 != 0) {
      pvVar2 = (buffer->string).vector.data;
      *(char *)((long)pvVar2 + -1) = (char)ZVar1;
      buffer->capacity = uVar4;
      (buffer->string).vector.data = (void *)(uVar5 + (long)pvVar2);
      uVar5 = 0xff;
      if (uVar4 < 0xff) {
        uVar5 = uVar4;
      }
      (buffer->string).vector.size = 1;
      (buffer->string).vector.capacity = uVar5;
      *(undefined1 *)((long)pvVar2 + ZVar1 + 2) = 0;
      pvVar2 = (buffer->string).vector.data;
      *(ZydisTokenType *)((long)pvVar2 + -2) = type;
      *(undefined1 *)((long)pvVar2 + -1) = 0;
      ZVar3 = 0x100000;
    }
  }
  return ZVar3;
}

Assistant:

ZyanStatus ZydisFormatterBufferAppend(ZydisFormatterBuffer* buffer, ZydisTokenType type)
{
    if (!buffer)
    {
        return ZYAN_STATUS_INVALID_ARGUMENT;
    }

    if (!buffer->is_token_list)
    {
        return ZYAN_STATUS_SUCCESS;
    }

    const ZyanUSize len = buffer->string.vector.size;
    ZYAN_ASSERT((len > 0) && (len < 256));
    if (buffer->capacity <= len + sizeof(ZydisFormatterToken))
    {
        return ZYAN_STATUS_INSUFFICIENT_BUFFER_SIZE;
    }

    ZydisFormatterToken* const last  = (ZydisFormatterToken*)buffer->string.vector.data - 1;
    last->next = (ZyanU8)len;

    const ZyanUSize delta = len + sizeof(ZydisFormatterToken);
    buffer->capacity -= delta;
    buffer->string.vector.data = (ZyanU8*)buffer->string.vector.data + delta;
    buffer->string.vector.size = 1;
    buffer->string.vector.capacity = ZYAN_MIN(buffer->capacity, 255);
    *(char*)buffer->string.vector.data = '\0';

    ZydisFormatterToken* const token = (ZydisFormatterToken*)buffer->string.vector.data - 1;
    token->type = type;
    token->next = 0;

    return ZYAN_STATUS_SUCCESS;
}